

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_setpoint.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionRotation_setpoint::ChFunctionRotation_setpoint
          (ChFunctionRotation_setpoint *this,ChFunctionRotation_setpoint *other)

{
  long lVar1;
  
  (this->super_ChFunctionRotation)._vptr_ChFunctionRotation =
       (_func_int **)&PTR__ChFunctionRotation_setpoint_00b46ce8;
  (this->Q).m_data[0] = 0.0;
  (this->Q).m_data[1] = 0.0;
  (this->Q).m_data[2] = 0.0;
  (this->Q).m_data[3] = 0.0;
  (this->W).m_data[0] = 0.0;
  (this->W).m_data[1] = 0.0;
  (this->W).m_data[2] = 0.0;
  (this->A).m_data[0] = 0.0;
  (this->Q).m_data[2] = 0.0;
  (this->Q).m_data[3] = 0.0;
  (this->W).m_data[0] = 0.0;
  (this->W).m_data[1] = 0.0;
  (this->W).m_data[2] = 0.0;
  (this->A).m_data[0] = 0.0;
  (this->A).m_data[1] = 0.0;
  (this->A).m_data[2] = 0.0;
  *(undefined1 (*) [32])(this->last_Q).m_data = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->last_Q).m_data + 3) = ZEXT432(0) << 0x40;
  this->mode = other->mode;
  this->S = other->S;
  if (other == this) {
    lVar1 = 0x68;
  }
  else {
    lVar1 = 0xa0;
    (this->Q).m_data[0] = (other->Q).m_data[0];
    (this->Q).m_data[1] = (other->Q).m_data[1];
    (this->Q).m_data[2] = (other->Q).m_data[2];
    (this->Q).m_data[3] = (other->Q).m_data[3];
    (this->W).m_data[0] = (other->W).m_data[0];
    (this->W).m_data[1] = (other->W).m_data[1];
    (this->W).m_data[2] = (other->W).m_data[2];
    (this->A).m_data[0] = (other->A).m_data[0];
    (this->A).m_data[1] = (other->A).m_data[1];
    (this->A).m_data[2] = (other->A).m_data[2];
    this->last_S = other->last_S;
    (this->last_Q).m_data[0] = (other->last_Q).m_data[0];
    (this->last_Q).m_data[1] = (other->last_Q).m_data[1];
    (this->last_Q).m_data[2] = (other->last_Q).m_data[2];
    (this->last_Q).m_data[3] = (other->last_Q).m_data[3];
    (this->last_W).m_data[0] = (other->last_W).m_data[0];
    (this->last_W).m_data[1] = (other->last_W).m_data[1];
  }
  *(undefined8 *)((long)(this->Q).m_data + lVar1 + -0x18) =
       *(undefined8 *)((long)(other->Q).m_data + lVar1 + -0x18);
  return;
}

Assistant:

ChFunctionRotation_setpoint::ChFunctionRotation_setpoint(const ChFunctionRotation_setpoint& other) {
    mode = other.mode;
    S = other.S;
    Q = other.Q;
    W = other.W;
    A = other.A;
    last_S = other.last_S;
    last_Q = other.last_Q;
    last_W = other.last_W;
}